

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::CountSetBits_i32(w3Interp *this)

{
  uint32_t *puVar1;
  uint32_t n;
  uint32_t uVar2;
  uint32_t uVar3;
  
  puVar1 = w3Stack::u32(&this->super_w3Stack);
  uVar2 = 0;
  for (uVar3 = *puVar1; uVar3 != 0; uVar3 = uVar3 >> 1) {
    uVar2 = uVar2 + (uVar3 & 1);
  }
  *puVar1 = uVar2;
  return;
}

Assistant:

INTERP (CountSetBits_i32)
{
    uint32_t& a = u32 ();
#if (_M_AMD64 || _M_IX86) && _MSC_VER > 1100 // TODO which version
    a = __popcnt (a);
#else
    a = count_set_bits (a);
#endif
}